

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall
itis::AVLTree<int>::display(AVLTree<int> *this,AVLTreeNode<int> *cur,int depth,int state)

{
  ostream *poVar1;
  int local_24;
  int i;
  int state_local;
  int depth_local;
  AVLTreeNode<int> *cur_local;
  AVLTree<int> *this_local;
  
  if (cur->left != (AVLTreeNode<int> *)0x0) {
    display(this,cur->left,depth + 1,1);
  }
  for (local_24 = 0; local_24 < depth; local_24 = local_24 + 1) {
    printf("     ");
  }
  if (state == 1) {
    printf(anon_var_dwarf_fa6f);
  }
  else if (state == 2) {
    printf(anon_var_dwarf_fa85);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->value);
  poVar1 = std::operator<<(poVar1,"] - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->count);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,cur->height);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (cur->right != (AVLTreeNode<int> *)0x0) {
    display(this,cur->right,depth + 1,2);
  }
  return;
}

Assistant:

void AVLTree<T>::display(AVLTreeNode<T> *cur, int depth, int state) {  // state: 1 -> left, 2 -> right , 0 -> root
    if (cur->left) {
      display(cur->left, depth + 1, 1);
    }

    for (int i = 0; i < depth; i++) {
      printf("     ");
    }

    if (state == 1) {  // left
      printf("┌───");
    } else if (state == 2) {  // right
      printf("└───");
    }

    std::cout << "[" << cur->value << "] - (" << cur->count << ", " << cur->height << ")" << std::endl;

    if (cur->right) {
      display(cur->right, depth + 1, 2);
    }
  }